

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::PrepareVisitor::internalVisit(PrepareVisitor *this,Atom *atom)

{
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::GenericData> data;
  allocator<char> local_59;
  undefined1 local_58 [16];
  string local_48;
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"VISITED",&local_59);
  StuntDouble::getPropertyByName((StuntDouble *)local_58,(string *)atom);
  std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_28,(__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_48);
  if (local_28._M_ptr != (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"VISITED",(allocator<char> *)local_58);
    StuntDouble::removeProperty(&atom->super_StuntDouble,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"ATOMDATA",&local_59);
  StuntDouble::getPropertyByName((StuntDouble *)local_58,(string *)atom);
  std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_28,(__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_48);
  if (local_28._M_ptr != (element_type *)0x0) {
    std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>
              ((shared_ptr<OpenMD::GenericData> *)local_58);
    if ((element_type *)local_58._0_8_ != (element_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"ATOMDATA",&local_59);
      StuntDouble::removeProperty(&atom->super_StuntDouble,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

void PrepareVisitor::internalVisit(Atom* atom) {
    std::shared_ptr<GenericData> data;

    // if visited property is  existed, remove it
    data = atom->getPropertyByName("VISITED");

    if (data != nullptr) { atom->removeProperty("VISITED"); }

    // remove atomdata
    data = atom->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      std::shared_ptr<AtomData> atomData =
          std::dynamic_pointer_cast<AtomData>(data);

      if (atomData != NULL) atom->removeProperty("ATOMDATA");
    }
  }